

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void pstack::print_container<pstack::Elf::Notes,char_const&>(ostream *os,Notes *container)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  size_t sVar1;
  char *__s;
  undefined1 local_e0 [8];
  iterator __end0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [8];
  iterator __begin0;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  Elf::Notes::begin((iterator *)local_80,container);
  Elf::Notes::end((iterator *)local_e0,container);
  __s = "";
  __return_storage_ptr__ =
       &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  while (((__begin0.object != __end0.object || (__begin0.phdrs != __end0.phdrs)) ||
         (__begin0.phdrsi._M_current != __end0.phdrsi._M_current))) {
    Elf::Notes::iterator::operator*((NoteDesc *)__return_storage_ptr__,(iterator *)local_80);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
    __begin0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    operator<<(os,(JSON<pstack::Elf::NoteDesc,_char> *)
                  &__begin0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    Elf::Notes::iterator::operator++((iterator *)local_80);
    __s = ",\n";
  }
  if (__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  if (__begin0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __begin0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}